

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::SatPreprocessor::addClause(SatPreprocessor *this,Literal *lits,uint32 size)

{
  Clause *x;
  uint in_EDX;
  Literal *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_EDX < 2) {
    if (in_EDX != 1) {
      return false;
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else {
    x = Clause::newClause((Literal *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                          (uint32)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    bk_lib::
    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
    ::push_back((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(Clause **)x);
  }
  return true;
}

Assistant:

bool SatPreprocessor::addClause(const Literal* lits, uint32 size) {
	if (size > 1) {
		clauses_.push_back( Clause::newClause(lits, size) );
	}
	else if (size == 1) {
		units_.push_back(lits[0]);
	}
	else {
		return false;
	}
	return true;
}